

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergePartialFromCodedStream
          (CodeGeneratorResponse_File *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  char *field_name;
  int iVar7;
  UnknownFieldSet *unknown_fields;
  ArenaStringPtr *pAVar8;
  char cVar9;
  uint tag;
  ulong uVar10;
  
  this_00 = &this->content_;
  this_01 = &this->insertion_point_;
  this_02 = &this->name_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001fbdce;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001fbdce:
      uVar5 = io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_001fbdf0:
      iVar7 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar4 = internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar7 = 6;
        if (bVar4) {
LAB_001fbf3f:
          iVar7 = 0;
        }
      }
    }
    else {
      uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar10;
      if (uVar6 == 0xf) {
        if (cVar9 == 'z') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          if ((this->content_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          bVar4 = internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
          field_name = "google.protobuf.compiler.CodeGeneratorResponse.File.content";
          pAVar8 = this_00;
          goto LAB_001fbf28;
        }
        goto LAB_001fbdf0;
      }
      if (uVar6 == 2) {
        if (cVar9 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          if ((this->insertion_point_).ptr_ ==
              (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          bVar4 = internal::WireFormatLite::ReadBytes(input,this_01->ptr_);
          field_name = "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point";
          pAVar8 = this_01;
          goto LAB_001fbf28;
        }
        goto LAB_001fbdf0;
      }
      if ((uVar6 != 1) || (cVar9 != '\n')) goto LAB_001fbdf0;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar4 = internal::WireFormatLite::ReadBytes(input,this_02->ptr_);
      field_name = "google.protobuf.compiler.CodeGeneratorResponse.File.name";
      pAVar8 = this_02;
LAB_001fbf28:
      iVar7 = 6;
      if (bVar4 != false) {
        internal::WireFormatLite::VerifyUtf8String
                  ((pAVar8->ptr_->_M_dataplus)._M_p,(int)pAVar8->ptr_->_M_string_length,PARSE,
                   field_name);
        goto LAB_001fbf3f;
      }
    }
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse_File::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorResponse.File.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string insertion_point = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_insertion_point()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->insertion_point().data(), this->insertion_point().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string content = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_content()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->content().data(), this->content().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorResponse.File.content");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.CodeGeneratorResponse.File)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.CodeGeneratorResponse.File)
  return false;
#undef DO_
}